

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O3

bool __thiscall cmCTestRunTest::NeedsToRerun(cmCTestRunTest *this)

{
  int *piVar1;
  bool bVar2;
  
  piVar1 = &this->NumberOfRunsLeft;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 != 0) {
    bVar2 = false;
    if ((this->RunUntilFail == true) && ((this->TestResult).Status == 9)) {
      this->RunAgain = true;
      bVar2 = true;
    }
    return bVar2;
  }
  return false;
}

Assistant:

bool cmCTestRunTest::NeedsToRerun()
{
  this->NumberOfRunsLeft--;
  if(this->NumberOfRunsLeft == 0)
    {
    return false;
    }
  // if number of runs left is not 0, and we are running until
  // we find a failed test, then return true so the test can be
  // restarted
  if(this->RunUntilFail
     && this->TestResult.Status == cmCTestTestHandler::COMPLETED)
    {
    this->RunAgain = true;
    return true;
    }
  return false;
}